

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest.pb.cc
# Opt level: O3

void __thiscall
proto2_unittest::TestNestedMessageHasBits_NestedMessage::Clear
          (TestNestedMessageHasBits_NestedMessage *this)

{
  anon_union_48_1_493b367e_for_TestNestedMessageHasBits_NestedMessage_3 *this_00;
  anon_union_48_1_493b367e_for_TestNestedMessageHasBits_NestedMessage_3 aVar1;
  int iVar2;
  bool is_soo;
  
  this_00 = &this->field_0;
  aVar1 = this->field_0;
  if (((undefined1  [48])aVar1 & (undefined1  [48])0x4) != (undefined1  [48])0x0) {
    google::protobuf::internal::LongSooRep::elements((LongSooRep *)&this_00->_impl_);
  }
  is_soo = ((undefined1  [48])aVar1 & (undefined1  [48])0x4) == (undefined1  [48])0x0;
  google::protobuf::internal::SooRep::size((SooRep *)&this_00->_impl_,is_soo);
  iVar2 = google::protobuf::internal::SooRep::size((SooRep *)&this_00->_impl_,is_soo);
  if ((iVar2 != 0) &&
     ((undefined1  [48])((undefined1  [48])*this_00 & (undefined1  [48])0x4) !=
      (undefined1  [48])0x0)) {
    google::protobuf::internal::LongSooRep::elements((LongSooRep *)&this_00->_impl_);
  }
  google::protobuf::RepeatedField<int>::set_size
            (&(this_00->_impl_).nestedmessage_repeated_int32_,
             ((undefined1  [48])aVar1 & (undefined1  [48])0x4) == (undefined1  [48])0x0,0);
  google::protobuf::internal::RepeatedPtrFieldBase::
  Clear<google::protobuf::internal::GenericTypeHandler<proto2_unittest::ForeignMessage>>
            (&(this->field_0)._impl_.nestedmessage_repeated_foreignmessage_.
              super_RepeatedPtrFieldBase);
  if (((this->super_Message).super_MessageLite._internal_metadata_.ptr_ & 1) == 0) {
    return;
  }
  google::protobuf::internal::InternalMetadata::DoClear<google::protobuf::UnknownFieldSet>
            (&(this->super_Message).super_MessageLite._internal_metadata_);
  return;
}

Assistant:

PROTOBUF_NOINLINE void TestNestedMessageHasBits_NestedMessage::Clear() {
// @@protoc_insertion_point(message_clear_start:proto2_unittest.TestNestedMessageHasBits.NestedMessage)
  ::google::protobuf::internal::TSanWrite(&_impl_);
  ::uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  _impl_.nestedmessage_repeated_int32_.Clear();
  _impl_.nestedmessage_repeated_foreignmessage_.Clear();
  _internal_metadata_.Clear<::google::protobuf::UnknownFieldSet>();
}